

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::load(ANN *this,string *filepath,bool reinitialize)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  uint k;
  uint n_col;
  uint i;
  uint n_col_00;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_perceptrons;
  string line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_weights;
  Matrix weight;
  ifstream file;
  byte abStack_3a0 [488];
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  weight.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  weight.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  weight.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file,(string *)filepath,_S_in);
  if ((abStack_3a0[*(long *)(_file + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [weight file]: Couldn\'t load weights!\n");
    exit(1);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line);
  uVar2 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&n_perceptrons,(ulong)uVar2);
  if (reinitialize) {
    std::vector<Layer,_std::allocator<Layer>_>::clear(&this->m_layers);
  }
  for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&file,(string *)&line,',');
    uVar3 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
    n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] = uVar3;
    if (reinitialize) {
      insert_layer(this,(uint)uVar8,uVar3);
    }
  }
  uVar8 = 0;
  while (uVar8 != uVar2 - 1) {
    if (reinitialize) {
      Matrix::set_shape(&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8].m_weights,
                        n_perceptrons.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8 + 1],
                        n_perceptrons.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
      Matrix::set_shape(&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8].m_biases,1,
                        n_perceptrons.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8 + 1]);
    }
    uVar7 = uVar8 + 1 & 0xffffffff;
    puVar4 = n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar3 = 0; uVar6 = puVar4[uVar7], uVar3 < uVar6; uVar3 = uVar3 + 1) {
      for (n_col = 0; n_col < puVar4[uVar8]; n_col = n_col + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&file,(string *)&line,',');
        dVar1 = std::__cxx11::stod(&line,(size_t *)0x0);
        pdVar5 = Matrix::set(&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar8].m_weights,uVar3,n_col)
        ;
        *pdVar5 = dVar1;
        puVar4 = n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
    }
    for (n_col_00 = 0; n_col_00 < uVar6; n_col_00 = n_col_00 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&line,',');
      dVar1 = std::__cxx11::stod(&line,(size_t *)0x0);
      pdVar5 = Matrix::set(&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar8].m_biases,0,n_col_00);
      *pdVar5 = dVar1;
      uVar6 = n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line)
    ;
    uVar8 = uVar8 + 1;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&file);
  Matrix::~Matrix(&weight);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&n_perceptrons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void ANN::load(const std::string& filepath, bool reinitialize){
    std::stringstream stream;
    std::string line;
    uint n_layer;
    std::vector<uint> n_perceptrons, n_weights;
    Matrix weight;

    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [weight file]: Couldn't load weights!\n";
        exit(1);
    }

    std::getline(file, line);
    n_layer=std::stoi(line);
    n_perceptrons.resize(n_layer);

    if(reinitialize) m_layers.clear();
    for(uint i=0;i<n_layer;++i){
        std::getline(file, line, ',');
        n_perceptrons[i]=std::stoi(line);
        if(reinitialize) insert_layer(i, n_perceptrons[i]);
    }

    for(uint i=0;i<n_layer-1;++i){
        if(reinitialize){
            m_layers[i].weights().set_shape(n_perceptrons[i+1], n_perceptrons[i]);
            m_layers[i].biases().set_shape(1, n_perceptrons[i+1]);
        }
        for(uint j=0;j<n_perceptrons[i+1];++j){
            for(uint k=0;k<n_perceptrons[i];++k){
                std::getline(file, line, ',');
                m_layers[i].weights().set(j, k)=std::stod(line);
            }
        }
        for(uint k=0;k<n_perceptrons[i+1];++k){
            std::getline(file, line, ',');
            m_layers[i].biases().set(0, k)=std::stod(line);
        }   std::getline(file, line);
    }

    file.close();
}